

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

bool test_encode_uint_custom_size(char *buf,uint64_t val,int size)

{
  char *pcVar1;
  char *pos;
  int size_local;
  uint64_t val_local;
  char *buf_local;
  
  switch(size) {
  case 1:
    if (val < 0x80) {
      mp_store_u8(buf,(uint8_t)val);
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
    break;
  case 2:
    if (val < 0x100) {
      pcVar1 = mp_store_u8(buf,0xcc);
      mp_store_u8(pcVar1,(uint8_t)val);
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
    break;
  case 3:
    if (val < 0x10000) {
      pcVar1 = mp_store_u8(buf,0xcd);
      mp_store_u16(pcVar1,(uint16_t)val);
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
    break;
  default:
    abort();
  case 5:
    if (val < 0x100000000) {
      pcVar1 = mp_store_u8(buf,0xce);
      mp_store_u32(pcVar1,(uint32_t)val);
      buf_local._7_1_ = true;
    }
    else {
      buf_local._7_1_ = false;
    }
    break;
  case 9:
    pcVar1 = mp_store_u8(buf,0xcf);
    mp_store_u64(pcVar1,val);
    buf_local._7_1_ = true;
  }
  return buf_local._7_1_;
}

Assistant:

static NOINLINE bool
test_encode_uint_custom_size(char *buf, uint64_t val, int size)
{
	char *pos;
	switch (size) {
	case 1:
		if (val > 0x7f)
			return false;
		mp_store_u8(buf, val);
		return true;
	case 2:
		if (val > UINT8_MAX)
			return false;
		pos = mp_store_u8(buf, 0xcc);
		mp_store_u8(pos, (uint8_t)val);
		return true;
	case 3:
		if (val > UINT16_MAX)
			return false;
		pos = mp_store_u8(buf, 0xcd);
		mp_store_u16(pos, (uint16_t)val);
		return true;
	case 5:
		if (val > UINT32_MAX)
			return false;
		pos = mp_store_u8(buf, 0xce);
		mp_store_u32(pos, (uint32_t)val);
		return true;
	case 9:
		pos = mp_store_u8(buf, 0xcf);
		mp_store_u64(pos, val);
		return true;
	}
	abort();
	return false;
}